

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

int Gia_ManIteratePaths(Gia_Man_t *p,int DelayC,int nPathMin,int nPathMax,int nPathLimit,
                       int fIgnoreBoxDelays,int fVerbose)

{
  undefined1 *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *__ptr;
  Vec_Int_t *pVVar6;
  int *__s;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int nBoxes;
  uint local_34;
  
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  __ptr = (int *)malloc(400);
  pVVar5->pArray = __ptr;
  if (p->vLevels != (Vec_Int_t *)0x0) {
    __assert_fail("p->vLevels == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecFadds.c"
                  ,0x4b1,"int Gia_ManIteratePaths(Gia_Man_t *, int, int, int, int, int, int)");
  }
  iVar9 = p->nObjs;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar2 = iVar9;
  }
  pVVar6->nCap = iVar2;
  if (iVar2 == 0) {
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = iVar9;
  }
  else {
    __s = (int *)malloc((long)iVar2 << 2);
    pVVar6->pArray = __s;
    pVVar6->nSize = iVar9;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar9 << 2);
    }
  }
  p->vLevels = pVVar6;
  Gia_ManCleanMark01(p);
  Gia_ManCleanPhase(p);
  pVVar6 = p->vCis;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      iVar9 = pVVar6->pArray[lVar7];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar9].field_0x7;
      *puVar1 = *puVar1 | 0x80;
      lVar7 = lVar7 + 1;
      pVVar6 = p->vCis;
    } while (lVar7 < pVVar6->nSize);
  }
  if (fVerbose != 0) {
    printf("Running path detection: BoxDelay = %d, PathMin = %d, PathMax = %d, PathLimit = %d.\n",
           (ulong)(uint)DelayC,(ulong)(uint)nPathMin,(ulong)(uint)nPathMax,nPathLimit);
  }
  if (0 < nPathLimit) {
    uVar10 = 0;
    uVar8 = 0;
    do {
      iVar9 = DelayC;
      uVar3 = Gia_ManFindAnnotatedDelay(p,DelayC,(int *)&local_34,fIgnoreBoxDelays);
      uVar4 = Gia_ManFindPath(p,iVar9,nPathMin,nPathMax,pVVar5);
      if (uVar4 == 0xffffffff) break;
      uVar10 = uVar10 + (0 < (int)uVar4);
      if (fVerbose != 0) {
        printf("Iter %5d : Paths = %2d. Boxes = %2d. Total boxes = %6d.  Max delay = %5d.\n",uVar8,
               (ulong)uVar10,(ulong)uVar4,(ulong)local_34,(ulong)uVar3);
      }
      uVar3 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar3;
    } while (nPathLimit != uVar3);
    __ptr = pVVar5->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(pVVar5);
  pVVar5 = p->vLevels;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vLevels->pArray = (int *)0x0;
      pVVar5 = p->vLevels;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_0067e074;
    }
    free(pVVar5);
    p->vLevels = (Vec_Int_t *)0x0;
  }
LAB_0067e074:
  Gia_ManCleanPhase(p);
  return 1;
}

Assistant:

int Gia_ManIteratePaths( Gia_Man_t * p, int DelayC, int nPathMin, int nPathMax, int nPathLimit, int fIgnoreBoxDelays, int fVerbose )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vPath = Vec_IntAlloc( 100 );
    int i, RetValue, nBoxes, MaxDelay, nPaths = 0;
    assert( p->vLevels == NULL );
    p->vLevels = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManCleanMark01( p );
    Gia_ManCleanPhase( p );
    Gia_ManForEachCi( p, pObj, i )
        pObj->fPhase = 1;
    if ( fVerbose )
        printf( "Running path detection: BoxDelay = %d, PathMin = %d, PathMax = %d, PathLimit = %d.\n", DelayC, nPathMin, nPathMax, nPathLimit );
    for ( i = 0; i < nPathLimit; i++ )
    {
        MaxDelay = Gia_ManFindAnnotatedDelay( p, DelayC, &nBoxes, fIgnoreBoxDelays );
        RetValue = Gia_ManFindPath( p, DelayC, nPathMin, nPathMax, vPath );
        if ( RetValue == -1 )
            break;
        nPaths += (RetValue > 0);
        if ( fVerbose )
            printf( "Iter %5d : Paths = %2d. Boxes = %2d. Total boxes = %6d.  Max delay = %5d.\n", i, nPaths, RetValue, nBoxes, MaxDelay );
    }
    Vec_IntFree( vPath );
    Vec_IntFreeP( &p->vLevels );
    Gia_ManCleanPhase( p );
    return 1;
}